

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O2

void If_DsdManMerge(If_DsdMan_t *p,If_DsdMan_t *pNew)

{
  Vec_Wrd_t *pVVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p_00;
  If_DsdObj_t *pObj;
  word *pwVar4;
  word *__dest;
  word Fill;
  ulong uVar5;
  int i;
  char *pcVar6;
  uint nLits;
  uint uVar7;
  char *pcVar8;
  int pFanins [12];
  
  if (p->nVars < pNew->nVars) {
    pcVar6 = "The number of variables should be the same or smaller.";
  }
  else {
    if (p->LutSize == pNew->LutSize) {
      if (p->nTtBits != pNew->nTtBits) {
        __assert_fail("p->nTtBits == pNew->nTtBits",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                      ,0x4c1,"void If_DsdManMerge(If_DsdMan_t *, If_DsdMan_t *)");
      }
      if (p->nConfigWords != pNew->nConfigWords) {
        __assert_fail("p->nConfigWords == pNew->nConfigWords",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                      ,0x4c2,"void If_DsdManMerge(If_DsdMan_t *, If_DsdMan_t *)");
      }
      iVar2 = If_DsdManHasMarks(p);
      iVar3 = If_DsdManHasMarks(pNew);
      if (iVar2 != iVar3) {
        iVar2 = If_DsdManHasMarks(p);
        pcVar6 = "";
        pcVar8 = "";
        if (iVar2 == 0) {
          pcVar8 = "no ";
        }
        iVar2 = If_DsdManHasMarks(pNew);
        if (iVar2 == 0) {
          pcVar6 = "no ";
        }
        printf("Warning! Old manager has %smarks while new manager has %smarks.\n",pcVar8,pcVar6);
      }
      p_00 = Vec_IntAlloc((pNew->vObjs).nSize);
      Vec_IntPush(p_00,0);
      Vec_IntPush(p_00,1);
      if ((p->vConfigs != (Vec_Wrd_t *)0x0) && (pNew->vConfigs != (Vec_Wrd_t *)0x0)) {
        Vec_WrdFillExtra(p->vConfigs,((pNew->vObjs).nSize + (p->vObjs).nSize) * p->nConfigWords,Fill
                        );
      }
      iVar2 = 2;
      do {
        iVar3 = (pNew->vObjs).nSize;
        if (iVar3 <= iVar2) {
          if (p_00->nSize != iVar3) {
            __assert_fail("Vec_IntSize(vMap) == Vec_PtrSize(&pNew->vObjs)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                          ,0x4db,"void If_DsdManMerge(If_DsdMan_t *, If_DsdMan_t *)");
          }
          Vec_IntFree(p_00);
          pVVar1 = p->vConfigs;
          if ((pVVar1 != (Vec_Wrd_t *)0x0) && (pNew->vConfigs != (Vec_Wrd_t *)0x0)) {
            iVar2 = (p->vObjs).nSize * p->nConfigWords;
            if (pVVar1->nSize < iVar2) {
              __assert_fail("p->nSize >= nSizeNew",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                            ,0x276,"void Vec_WrdShrink(Vec_Wrd_t *, int)");
            }
            pVVar1->nSize = iVar2;
          }
          return;
        }
        pObj = (If_DsdObj_t *)Vec_PtrEntry(&pNew->vObjs,iVar2);
        uVar5 = 0;
        while( true ) {
          uVar7 = *(uint *)&pObj->field_0x4;
          nLits = uVar7 >> 0x1b;
          if (nLits <= uVar5) break;
          iVar3 = If_DsdObjFaninLit(pObj,(int)uVar5);
          if (iVar3 == 0) {
            uVar7 = *(uint *)&pObj->field_0x4;
            nLits = uVar7 >> 0x1b;
            break;
          }
          iVar3 = Abc_Lit2LitV(p_00->pArray,iVar3);
          pFanins[uVar5] = iVar3;
          uVar5 = uVar5 + 1;
        }
        if ((uVar7 & 7) == 6) {
          pwVar4 = If_DsdObjTruth(pNew,pObj);
        }
        else {
          pwVar4 = (word *)0x0;
        }
        iVar3 = If_DsdObjFindOrAdd(p,uVar7 & 7,pFanins,nLits,pwVar4);
        if ((pObj->field_0x5 & 1) != 0) {
          If_DsdVecObjSetMark(&p->vObjs,iVar3);
        }
        if (((p->vConfigs != (Vec_Wrd_t *)0x0) &&
            (pVVar1 = pNew->vConfigs, pVVar1 != (Vec_Wrd_t *)0x0)) &&
           (i = p->nConfigWords * iVar2, i < pVVar1->nSize)) {
          pwVar4 = Vec_WrdEntryP(pVVar1,i);
          __dest = Vec_WrdEntryP(p->vConfigs,p->nConfigWords * iVar3);
          memcpy(__dest,pwVar4,(long)p->nConfigWords << 3);
        }
        Vec_IntPush(p_00,iVar3);
        iVar2 = iVar2 + 1;
      } while( true );
    }
    pcVar6 = "LUT size should be the same.";
  }
  puts(pcVar6);
  return;
}

Assistant:

void If_DsdManMerge( If_DsdMan_t * p, If_DsdMan_t * pNew )
{
    If_DsdObj_t * pObj; 
    Vec_Int_t * vMap;
    int pFanins[DAU_MAX_VAR];
    int i, k, iFanin, Id;
    if ( p->nVars < pNew->nVars )
    {
        printf( "The number of variables should be the same or smaller.\n" );
        return;
    }
    if ( p->LutSize != pNew->LutSize )
    {
        printf( "LUT size should be the same.\n" );
        return;
    }
    assert( p->nTtBits == pNew->nTtBits );
    assert( p->nConfigWords == pNew->nConfigWords );
    if ( If_DsdManHasMarks(p) != If_DsdManHasMarks(pNew) )
        printf( "Warning! Old manager has %smarks while new manager has %smarks.\n", 
            If_DsdManHasMarks(p) ? "" : "no ", If_DsdManHasMarks(pNew) ? "" : "no " );
    vMap = Vec_IntAlloc( Vec_PtrSize(&pNew->vObjs) );
    Vec_IntPush( vMap, 0 );
    Vec_IntPush( vMap, 1 );
    if ( p->vConfigs && pNew->vConfigs )
        Vec_WrdFillExtra( p->vConfigs, p->nConfigWords * (Vec_PtrSize(&p->vObjs) + Vec_PtrSize(&pNew->vObjs)), 0 );
    If_DsdVecForEachNode( &pNew->vObjs, pObj, i )
    {
        If_DsdObjForEachFaninLit( &pNew->vObjs, pObj, iFanin, k )
            pFanins[k] = Abc_Lit2LitV( Vec_IntArray(vMap), iFanin );
        Id = If_DsdObjFindOrAdd( p, pObj->Type, pFanins, pObj->nFans, pObj->Type == IF_DSD_PRIME ? If_DsdObjTruth(pNew, pObj) : NULL );
        if ( pObj->fMark )
            If_DsdVecObjSetMark( &p->vObjs, Id );
        if ( p->vConfigs && pNew->vConfigs && p->nConfigWords * i < Vec_WrdSize(pNew->vConfigs) )
        {
            //Vec_WrdFillExtra( p->vConfigs, Id, Vec_WrdEntry(pNew->vConfigs, i) );
            word * pConfigNew = Vec_WrdEntryP(pNew->vConfigs, p->nConfigWords * i);
            word * pConfigOld = Vec_WrdEntryP(p->vConfigs, p->nConfigWords * Id);
            memcpy( pConfigOld, pConfigNew, sizeof(word) * p->nConfigWords );
        }
        Vec_IntPush( vMap, Id );
    }
    assert( Vec_IntSize(vMap) == Vec_PtrSize(&pNew->vObjs) );
    Vec_IntFree( vMap );
    if ( p->vConfigs && pNew->vConfigs )
        Vec_WrdShrink( p->vConfigs, p->nConfigWords * Vec_PtrSize(&p->vObjs) );
}